

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long stop;
  PrimeExtractor *this;
  PrimeExtractor *pe;
  long range;
  char *pEnd;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pEnd = (char *)argv;
  argv_local._0_4_ = argc;
  stop = strtol(argv[1],(char **)&range,10);
  this = (PrimeExtractor *)operator_new(0x40);
  PrimeExtractor::PrimeExtractor(this,stop);
  PrimeExtractor::extract(this);
  if (this != (PrimeExtractor *)0x0) {
    PrimeExtractor::~PrimeExtractor(this);
    operator_delete(this,0x40);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    
    char * pEnd;
    long range = strtol(argv[1], &pEnd, 10);
  
    PrimeExtractor * pe = new PrimeExtractor(range);
    pe->extract();
    
    delete pe;
    return 0;
    
}